

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O3

void __thiscall
cppcms::impl::cgi::connection::async_write_response
          (connection *this,response *response,bool complete_response,ehandler *h)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  async_write_binder *paVar4;
  undefined4 extraout_var;
  async_write_binder *tmp_1;
  intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> tmp;
  error_code e;
  intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> local_98;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_90;
  intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> local_88;
  intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> local_80;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  void *local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  error_code local_40;
  
  local_98.p_ = (async_write_binder *)0x0;
  paVar4 = (this->cached_async_write_binder_).p_;
  if (paVar4 == (async_write_binder *)0x0) {
    paVar4 = (async_write_binder *)operator_new(0x30);
    (paVar4->super_callable<void_(const_std::error_code_&)>).super_refcounted._vptr_refcounted =
         (_func_int **)0x0;
    *(undefined8 *)&(paVar4->super_callable<void_(const_std::error_code_&)>).super_refcounted.refs_
         = 0;
    (paVar4->h).call_ptr.p_ = (callable<void_(cppcms::http::context::completion_type)> *)0x0;
    *(undefined8 *)&paVar4->complete_response = 0;
    (paVar4->conn).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (paVar4->conn).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (paVar4->super_callable<void_(const_std::error_code_&)>).super_refcounted._vptr_refcounted =
         (_func_int **)&PTR__refcounted_00284bd0;
    booster::atomic_counter::atomic_counter
              (&(paVar4->super_callable<void_(const_std::error_code_&)>).super_refcounted.refs_,0);
    (paVar4->super_callable<void_(const_std::error_code_&)>).super_refcounted._vptr_refcounted =
         (_func_int **)&PTR__async_write_binder_00284f60;
    (paVar4->conn).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (paVar4->conn).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (paVar4->h).call_ptr.p_ = (callable<void_(cppcms::http::context::completion_type)> *)0x0;
    booster::atomic_counter::inc();
    local_78 = (element_type *)local_98.p_;
    local_98.p_ = paVar4;
    booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::~intrusive_ptr
              ((intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> *)&local_78);
  }
  else {
    (this->cached_async_write_binder_).p_ = (async_write_binder *)0x0;
    local_98.p_ = paVar4;
  }
  std::__shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::cgi::connection,void>
            ((__shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2> *)&local_78,
             (__weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<cppcms::impl::cgi::connection>);
  p_Var2 = p_Stack_70;
  peVar1 = local_78;
  local_78 = (element_type *)0x0;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = ((local_98.p_)->conn).
            super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  ((local_98.p_)->conn).
  super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  ((local_98.p_)->conn).
  super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
    }
  }
  if (&(local_98.p_)->h != h) {
    booster::intrusive_ptr<booster::callable<void_(cppcms::http::context::completion_type)>_>::
    operator=(&((local_98.p_)->h).call_ptr,&h->call_ptr);
  }
  (local_98.p_)->complete_response = complete_response;
  local_40._M_value = 0;
  local_40._M_cat = (error_category *)std::_V2::system_category();
  iVar3 = cppcms::http::response::flush_async_chunk(response,&local_40);
  if ((iVar3 == 0) &&
     ((this->pending_output_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->pending_output_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_78 = (element_type *)((ulong)local_78 & 0xffffffff00000000);
    local_60 = (void *)0x0;
    uStack_58 = 0;
    local_50 = 0;
    local_88.p_ = local_98.p_;
    if (local_98.p_ == (async_write_binder *)0x0) {
      local_90.p_ = (callable<void_(const_std::error_code_&)> *)0x0;
    }
    else {
      booster::atomic_counter::inc();
      local_90.p_ = &(local_88.p_)->super_callable<void_(const_std::error_code_&)>;
      if (local_88.p_ != (async_write_binder *)0x0) {
        booster::atomic_counter::inc();
      }
    }
    (*this->_vptr_connection[5])(this,&local_78,0,&local_90);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_90);
    booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::~intrusive_ptr
              (&local_88);
    if (local_60 != (void *)0x0) {
      operator_delete(local_60);
    }
  }
  else {
    iVar3 = (*this->_vptr_connection[0xc])(this);
    local_80.p_ = local_98.p_;
    if (local_98.p_ == (async_write_binder *)0x0) {
      local_78 = (element_type *)0x0;
    }
    else {
      booster::atomic_counter::inc();
      local_78 = (element_type *)local_80.p_;
      if (local_80.p_ != (async_write_binder *)0x0) {
        booster::atomic_counter::inc();
      }
    }
    booster::aio::io_service::post((callback *)CONCAT44(extraout_var,iVar3),(error_code *)&local_78)
    ;
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_78);
    booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::~intrusive_ptr
              (&local_80);
  }
  booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::~intrusive_ptr
            (&local_98);
  return;
}

Assistant:

void connection::async_write_response(	http::response &response,
					bool complete_response,
					ehandler const &h)
{
	//  prepare cached binder
	booster::intrusive_ptr<connection::async_write_binder> tmp;
	if(cached_async_write_binder_) {
		tmp.swap(cached_async_write_binder_);
	}
	if(!tmp) {
		tmp = new connection::async_write_binder();
	}
	tmp->conn = self();
	tmp->h = h;
	tmp->complete_response = complete_response;
	// ready

	booster::system::error_code e;
	if(response.flush_async_chunk(e)!=0 || !has_pending()) {
		get_io_service().post(tmp,e);
		return;
	}
	async_write(booster::aio::const_buffer(),false,tmp);
}